

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O3

int __thiscall
xla::GraphCycles::FindPath(GraphCycles *this,int32_t x,int32_t y,int max_path_len,int32_t *path)

{
  int iVar1;
  Rep *pRVar2;
  pointer pNVar3;
  int *piVar4;
  iterator iVar5;
  int *piVar6;
  int iVar7;
  long lVar8;
  pair<std::__detail::_Node_iterator<int,_true,_false>,_bool> pVar9;
  int w;
  NodeSet seen;
  int local_90;
  int32_t local_8c;
  int local_88;
  int32_t local_84;
  vector<int,std::allocator<int>> *local_80;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_78;
  int32_t *local_70;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  pRVar2 = this->rep_;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  piVar4 = (pRVar2->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar5._M_current =
       (pRVar2->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar5._M_current != piVar4) {
    (pRVar2->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar4;
    iVar5._M_current = piVar4;
  }
  local_8c = y;
  local_88 = max_path_len;
  local_84 = x;
  local_70 = path;
  if (iVar5._M_current ==
      (pRVar2->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&pRVar2->stack_,iVar5,&local_84);
    piVar4 = (pRVar2->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (pRVar2->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  else {
    *iVar5._M_current = x;
    piVar6 = iVar5._M_current + 1;
    (pRVar2->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar6;
  }
  if (piVar4 != piVar6) {
    iVar7 = 0;
    local_80 = (vector<int,std::allocator<int>> *)&pRVar2->stack_;
    do {
      iVar5._M_current = piVar6 + -1;
      iVar1 = piVar6[-1];
      lVar8 = (long)iVar1;
      (pRVar2->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish = iVar5._M_current;
      if (lVar8 < 0) {
        iVar7 = iVar7 + -1;
      }
      else {
        if (iVar7 < local_88) {
          local_70[iVar7] = iVar1;
        }
        local_78 = (_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)CONCAT44(local_78._4_4_,0xffffffff);
        if (iVar5._M_current ==
            (pRVar2->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)local_80,iVar5,(int *)&local_78);
        }
        else {
          piVar6[-1] = -1;
          (pRVar2->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = piVar6;
        }
        iVar7 = iVar7 + 1;
        if (iVar1 == local_8c) goto LAB_0019887b;
        pNVar3 = (pRVar2->node_io_).
                 super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        piVar6 = *(pointer *)
                  ((long)&pNVar3[lVar8].out.value_sequence_.
                          super__Vector_base<int,_std::allocator<int>_> + 8);
        for (piVar4 = *(int **)&pNVar3[lVar8].out.value_sequence_.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl;
            piVar4 != piVar6; piVar4 = piVar4 + 1) {
          local_90 = *piVar4;
          local_78 = &local_68;
          pVar9 = std::
                  _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  ::
                  _M_insert<int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
                            ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                              *)&local_68,&local_90,&local_78);
          if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            iVar5._M_current =
                 (pRVar2->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (pRVar2->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (local_80,iVar5,&local_90);
            }
            else {
              *iVar5._M_current = local_90;
              (pRVar2->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar5._M_current + 1;
            }
          }
        }
      }
      piVar6 = (pRVar2->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    } while ((pRVar2->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start != piVar6);
  }
  iVar7 = 0;
LAB_0019887b:
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return iVar7;
}

Assistant:

int GraphCycles::FindPath(int32_t x, int32_t y, int max_path_len,
                          int32_t path[]) const {
  // Forward depth first search starting at x until we hit y.
  // As we descend into a node, we push it onto the path.
  // As we leave a node, we remove it from the path.
  int path_len = 0;

  Rep* r = rep_;
  NodeSet seen;
  r->stack_.clear();
  r->stack_.push_back(x);
  while (!r->stack_.empty()) {
    int32_t n = r->stack_.back();
    r->stack_.pop_back();
    if (n < 0) {
      // Marker to indicate that we are leaving a node
      path_len--;
      continue;
    }

    if (path_len < max_path_len) {
      path[path_len] = n;
    }
    path_len++;
    r->stack_.push_back(-1);  // Will remove tentative path entry

    if (n == y) {
      return path_len;
    }

    for (auto w : r->node_io_[n].out.GetSequence()) {
      if (seen.insert(w).second) {
        r->stack_.push_back(w);
      }
    }
  }

  return 0;
}